

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void start_monitoring_volume(void)

{
  long lVar1;
  pa_operation *op;
  
  report_volume();
  pa_context_set_subscribe_callback(pa,subscribe_cb,0);
  lVar1 = pa_context_subscribe(pa,1,0);
  if (lVar1 != 0) {
    pa_operation_unref(lVar1);
    return;
  }
  __assert_fail("op",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/main.cpp"
                ,0xc5,"void start_monitoring_volume()");
}

Assistant:

void start_monitoring_volume() {
    report_volume();

    pa_context_set_subscribe_callback(pa, subscribe_cb, NULL);
    pa_operation *op = pa_context_subscribe(pa, (pa_subscription_mask_t)
            (PA_SUBSCRIPTION_MASK_SINK), NULL, NULL);
    assert(op);
    pa_operation_unref(op);
}